

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_match.c
# Opt level: O0

int jit_machine_stack_exec(jit_arguments *arguments,jit_function executable_func)

{
  int iVar1;
  undefined1 local_8038 [8];
  sljit_stack local_stack;
  sljit_u8 local_space [32768];
  jit_function executable_func_local;
  jit_arguments *arguments_local;
  
  local_stack.start = (sljit_u8 *)&local_stack.min_start;
  local_stack.end = (sljit_u8 *)&local_stack.min_start;
  local_stack.top = local_space + 0x7ff8;
  local_8038 = (undefined1  [8])(local_space + 0x7ff8);
  arguments->stack = (sljit_stack *)local_8038;
  local_space._32760_8_ = executable_func;
  iVar1 = (*executable_func)(arguments);
  return iVar1;
}

Assistant:

static SLJIT_NOINLINE int jit_machine_stack_exec(jit_arguments *arguments, jit_function executable_func)
{
sljit_u8 local_space[MACHINE_STACK_SIZE];
struct sljit_stack local_stack;

local_stack.min_start = local_space;
local_stack.start = local_space;
local_stack.end = local_space + MACHINE_STACK_SIZE;
local_stack.top = local_space + MACHINE_STACK_SIZE;
arguments->stack = &local_stack;
return executable_func(arguments);
}